

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O2

void __thiscall ON_wString::ShrinkArray(ON_wString *this)

{
  ON_Internal_Empty_wString *hdr;
  wchar_t wVar1;
  int iVar2;
  wchar_t *__src;
  wchar_t *__dest;
  void *pvVar3;
  ON_Internal_Empty_wString *pOVar4;
  
  __src = this->m_s;
  hdr = (ON_Internal_Empty_wString *)(__src + -3);
  if (hdr != &empty_wstring && __src != (wchar_t *)0x0) {
    if (__src[-2] < L'\x01') {
      Destroy(this);
      this->m_s = (wchar_t *)0x84a45c;
    }
    else {
      if (1 < (hdr->header).ref_count.super___atomic_base<int>._M_i) {
        this->m_s = (wchar_t *)0x84a45c;
        CreateArray(this,__src[-2]);
        __dest = this->m_s;
        pOVar4 = (ON_Internal_Empty_wString *)(__dest + -3);
        if (__dest == (wchar_t *)0x0) {
          pOVar4 = &empty_wstring;
        }
        memcpy(__dest,__src,(long)__src[-2] << 2);
        wVar1 = __src[-2];
        (pOVar4->header).string_length = wVar1;
        this->m_s[wVar1] = L'\0';
        ON_wStringHeader_DecrementRefCountAndDeleteIfZero((ON_wStringHeader *)hdr);
        return;
      }
      if (__src[-2] < __src[-1]) {
        pvVar3 = onrealloc(hdr,(long)__src[-2] * 4 + 0x10);
        iVar2 = *(int *)((long)pvVar3 + 4);
        *(int *)((long)pvVar3 + 8) = iVar2;
        this->m_s = (wchar_t *)((long)pvVar3 + 0xc);
        *(undefined4 *)((long)pvVar3 + (long)iVar2 * 4 + 0xc) = 0;
      }
    }
  }
  return;
}

Assistant:

ON_wStringHeader* ON_wString::Header() const
{
  ON_wStringHeader* hdr = (ON_wStringHeader*)m_s;
  if (hdr)
    hdr--;
  else
    hdr = &empty_wstring.header;
  return hdr;
}